

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O2

void deqp::gles2::Functional::getAffineTexCoord2D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  pointer pfVar1;
  Vec2 p3;
  Vec2 p2;
  Vec2 p1;
  Vector<float,_2> local_70;
  Vec2 p0;
  Mat2 transform;
  Mat2 shearMatrix;
  Mat2 rotMatrix;
  
  getBasicTexCoord2D(dst,cellNdx);
  tcu::rotationMatrix((tcu *)&rotMatrix,(float)cellNdx * 0.0625 * 6.2831855);
  if (cellNdx - 4U < 8) {
    transform.m_data.m_data[0].m_data[0] = (float)(0xf - cellNdx) * 0.0625;
  }
  else {
    transform.m_data.m_data[0].m_data[0] = 0.0;
  }
  transform.m_data.m_data[0].m_data[1] = 0.0;
  tcu::shearMatrix((tcu *)&shearMatrix,(Vector<float,_2> *)&transform);
  tcu::operator*((tcu *)&transform,(Matrix<float,_2,_2> *)&rotMatrix,
                 (Matrix<float,_2,_2> *)&shearMatrix);
  p1.m_data = *(float (*) [2])
               (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
  tcu::operator*((tcu *)&p0,(Matrix<float,_2,_2> *)&transform,&p1);
  p2.m_data = *(float (*) [2])
               ((dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start + 2);
  tcu::operator*((tcu *)&p1,(Matrix<float,_2,_2> *)&transform,&p2);
  p3.m_data = *(float (*) [2])
               ((dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start + 4);
  tcu::operator*((tcu *)&p2,(Matrix<float,_2,_2> *)&transform,&p3);
  local_70.m_data =
       *(float (*) [2])
        ((dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_start + 6);
  tcu::operator*((tcu *)&p3,(Matrix<float,_2,_2> *)&transform,&local_70);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *pfVar1 = p0.m_data[0];
  pfVar1[1] = p0.m_data[1];
  pfVar1[2] = p1.m_data[0];
  pfVar1[3] = p1.m_data[1];
  pfVar1[4] = p2.m_data[0];
  pfVar1[5] = p2.m_data[1];
  pfVar1[6] = p3.m_data[0];
  pfVar1[7] = p3.m_data[1];
  return;
}

Assistant:

static void getAffineTexCoord2D (std::vector<float>& dst, int cellNdx)
{
	// Use basic coords as base.
	getBasicTexCoord2D(dst, cellNdx);

	// Rotate based on cell index.
	float		angle		= 2.0f*DE_PI * ((float)cellNdx / 16.0f);
	tcu::Mat2	rotMatrix	= tcu::rotationMatrix(angle);

	// Second and third row are sheared.
	float		shearX		= de::inRange(cellNdx, 4, 11) ? (float)(15-cellNdx) / 16.0f : 0.0f;
	tcu::Mat2	shearMatrix	= tcu::shearMatrix(tcu::Vec2(shearX, 0.0f));

	tcu::Mat2	transform	= rotMatrix * shearMatrix;
	Vec2		p0			= transform * Vec2(dst[0], dst[1]);
	Vec2		p1			= transform * Vec2(dst[2], dst[3]);
	Vec2		p2			= transform * Vec2(dst[4], dst[5]);
	Vec2		p3			= transform * Vec2(dst[6], dst[7]);

	dst[0] = p0.x();	dst[1] = p0.y();
	dst[2] = p1.x();	dst[3] = p1.y();
	dst[4] = p2.x();	dst[5] = p2.y();
	dst[6] = p3.x();	dst[7] = p3.y();
}